

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int mjs::operator_precedence(token_type tt)

{
  int local_c;
  token_type tt_local;
  
  switch(tt) {
  case rshiftshiftequal:
  case lshiftequal:
  case rshiftequal:
  case plusequal:
  case minusequal:
  case multiplyequal:
  case divideequal:
  case andequal:
  case orequal:
  case xorequal:
  case modequal:
  case equal:
  case question:
    local_c = 0xf;
    break;
  case rshiftshift:
  case lshift:
  case rshift:
    local_c = 7;
    break;
  case equalequalequal:
  case notequalequal:
  case equalequal:
  case notequal:
    local_c = 9;
    break;
  case ltequal:
  case gtequal:
  case gt:
  case lt:
  case in_:
  case instanceof_:
    local_c = 8;
    break;
  case andand:
    local_c = 0xd;
    break;
  case oror:
    local_c = 0xd;
    break;
  default:
    local_c = 0x11;
    break;
  case comma:
    local_c = 0x10;
    break;
  case plus:
  case minus:
    local_c = 6;
    break;
  case multiply:
  case divide:
  case mod:
    local_c = 5;
    break;
  case and_:
    local_c = 10;
    break;
  case or_:
    local_c = 0xc;
    break;
  case xor_:
    local_c = 0xb;
  }
  return local_c;
}

Assistant:

int operator_precedence(token_type tt) {
    switch (tt) {
        // Don't handle dot here
    case token_type::multiply:
    case token_type::divide:
    case token_type::mod:
        return 5;
    case token_type::plus:
    case token_type::minus:
        return 6;
    case token_type::lshift:
    case token_type::rshift:
    case token_type::rshiftshift:
        return 7;
    case token_type::lt:
    case token_type::ltequal:
    case token_type::gt:
    case token_type::gtequal:
    case token_type::in_:
    case token_type::instanceof_:
        return 8;
    case token_type::equalequal:
    case token_type::equalequalequal:
    case token_type::notequal:
    case token_type::notequalequal:
        return 9;
    case token_type::and_:
        return 10;
    case token_type::xor_:
        return 11;
    case token_type::or_:
        return 12;
    case token_type::andand:
        return 13;
    case token_type::oror:
        return 13;
    case token_type::question:
    case token_type::equal:
    case token_type::plusequal:
    case token_type::minusequal:
    case token_type::multiplyequal:
    case token_type::divideequal:
    case token_type::modequal:
    case token_type::lshiftequal:
    case token_type::rshiftequal:
    case token_type::rshiftshiftequal:
    case token_type::andequal:
    case token_type::orequal:
    case token_type::xorequal:
        return assignment_precedence;
    case token_type::comma:
        return comma_precedence;
    default:
        return comma_precedence + 1;
    }
}